

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void prt_equippy(wchar_t row,wchar_t col)

{
  object *obj_00;
  object *obj;
  byte local_15;
  wchar_t c;
  uint8_t a;
  wchar_t i;
  wchar_t col_local;
  wchar_t row_local;
  
  for (c = L'\0'; c < (int)(uint)(player->body).count; c = c + L'\x01') {
    obj_00 = slot_object(player,c);
    if (((obj_00 == (object *)0x0) || (tile_width != '\x01')) || (tile_height != '\x01')) {
      obj._4_4_ = L' ';
      local_15 = 1;
    }
    else {
      obj._4_4_ = object_char(obj_00);
      local_15 = object_attr(obj_00);
    }
    Term_putch(col + c,row,(uint)local_15,obj._4_4_);
  }
  return;
}

Assistant:

static void prt_equippy(int row, int col)
{
	int i;

	uint8_t a;
	wchar_t c;

	struct object *obj;

	/* Dump equippy chars */
	for (i = 0; i < player->body.count; i++) {
		/* Object */
		obj = slot_object(player, i);

		/* Get attr/char for display; clear if big tiles or no object */
		if (obj && tile_width == 1 && tile_height == 1) {
			c = object_char(obj);
			a = object_attr(obj);
		} else {
			c = L' ';
			a = COLOUR_WHITE;
		}

		/* Dump */
		Term_putch(col + i, row, a, c);
	}
}